

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O0

void __thiscall
KDReports::SpreadsheetReportLayout::paintIcon
          (SpreadsheetReportLayout *this,QPainter *painter,QRectF *cellContentsRect,
          QVariant *cellDecoration)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  qreal qVar4;
  QPoint local_118;
  QPointF local_110;
  QPoint local_fc;
  QPoint local_f4;
  QPoint topLeft;
  QImage local_e0 [4];
  int y;
  QPixmap local_c8 [28];
  undefined4 local_ac;
  undefined1 local_a8 [32];
  QImage img;
  double local_78;
  qreal height;
  QPixmap local_68 [40];
  undefined1 local_40 [8];
  QPixmap pix;
  QVariant *cellDecoration_local;
  QRectF *cellContentsRect_local;
  QPainter *painter_local;
  SpreadsheetReportLayout *this_local;
  
  qvariant_cast<QPixmap>((QVariant *)local_40);
  bVar1 = QPixmap::isNull();
  if ((bVar1 & 1) != 0) {
    qvariant_cast<QIcon>((QVariant *)&height);
    QIcon::pixmap((QSize *)local_68,(Mode)&height,(int)this + 0x88);
    QPixmap::operator=((QPixmap *)local_40,local_68);
    QPixmap::~QPixmap(local_68);
    QIcon::~QIcon((QIcon *)&height);
  }
  iVar2 = QPixmap::height();
  QImage::QImage((QImage *)(local_a8 + 0x18));
  bVar1 = QPixmap::isNull();
  if ((bVar1 & 1) != 0) {
    qvariant_cast<QImage>((QVariant *)local_a8);
    QImage::operator=((QImage *)(local_a8 + 0x18),(QImage *)local_a8);
    QImage::~QImage((QImage *)local_a8);
    bVar1 = QImage::isNull();
    if ((bVar1 & 1) != 0) {
      local_ac = 1;
      goto LAB_0018d934;
    }
    iVar2 = QImage::height();
  }
  qVar4 = TableLayout::scalingFactor(&this->m_tableLayout);
  if ((qVar4 != 1.0) || (NAN(qVar4))) {
    bVar1 = QPixmap::isNull();
    if ((bVar1 & 1) == 0) {
      iVar2 = QPixmap::width();
      qVar4 = TableLayout::scalingFactor(&this->m_tableLayout);
      iVar2 = qRound((double)iVar2 * qVar4);
      QPixmap::scaledToWidth(local_c8,local_40,iVar2,0);
      QPixmap::operator=((QPixmap *)local_40,local_c8);
      QPixmap::~QPixmap(local_c8);
      iVar2 = QPixmap::height();
    }
    else {
      iVar2 = QImage::width();
      qVar4 = TableLayout::scalingFactor(&this->m_tableLayout);
      iVar2 = qRound((double)iVar2 * qVar4);
      QImage::scaledToWidth(local_e0,local_a8 + 0x18,iVar2,0);
      QImage::operator=((QImage *)(local_a8 + 0x18),local_e0);
      QImage::~QImage(local_e0);
      iVar2 = QImage::height();
    }
  }
  local_78 = (double)iVar2;
  topLeft.yp = 0;
  qVar4 = QRectF::height(cellContentsRect);
  topLeft.xp = (int)((qVar4 - local_78) * 0.5);
  piVar3 = qMax<int>(&topLeft.yp,&topLeft.xp);
  iVar2 = *piVar3;
  local_110 = QRectF::topLeft(cellContentsRect);
  local_fc = QPointF::toPoint(&local_110);
  QPoint::QPoint(&local_118,0,iVar2);
  local_f4 = operator+(&local_fc,&local_118);
  bVar1 = QImage::isNull();
  if ((bVar1 & 1) == 0) {
    QPainter::drawImage(painter,&local_f4,(QImage *)(local_a8 + 0x18));
  }
  else {
    QPainter::drawPixmap(painter,&local_f4,(QPixmap *)local_40);
  }
  local_ac = 0;
LAB_0018d934:
  QImage::~QImage((QImage *)(local_a8 + 0x18));
  QPixmap::~QPixmap((QPixmap *)local_40);
  return;
}

Assistant:

void KDReports::SpreadsheetReportLayout::paintIcon(QPainter &painter, const QRectF &cellContentsRect, const QVariant &cellDecoration) const
{
    QPixmap pix = qvariant_cast<QPixmap>(cellDecoration);
    if (pix.isNull()) {
        pix = qvariant_cast<QIcon>(cellDecoration).pixmap(m_tableLayout.m_iconSize);
    }
    qreal height = pix.height();
    QImage img;
    if (pix.isNull()) {
        img = qvariant_cast<QImage>(cellDecoration);
        if (img.isNull())
            return;
        height = img.height();
    }

    // Now either img or pix is set.

    // Apply scaling factor
    if (m_tableLayout.scalingFactor() != 1.) {
        if (!pix.isNull()) {
            pix = pix.scaledToWidth(qRound(pix.width() * m_tableLayout.scalingFactor()));
            height = pix.height();
        } else {
            img = img.scaledToWidth(qRound(img.width() * m_tableLayout.scalingFactor()));
            height = img.height();
        }
    }

    // Vertical centering
    const int y = qMax(0, int((cellContentsRect.height() - height) / 2.0));
    const QPoint topLeft = cellContentsRect.topLeft().toPoint() + QPoint(0, y);
    if (!img.isNull()) {
        // Draw img
        painter.drawImage(topLeft, img);
    } else {
        // Draw pix
        painter.drawPixmap(topLeft, pix);
    }
}